

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscanf.c
# Opt level: O1

int main(void)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  undefined8 *puVar4;
  byte bVar5;
  int i;
  int n;
  uint u;
  int *p;
  char source [100];
  char buffer [100];
  int local_11c;
  int local_118;
  int local_114;
  int *local_110;
  undefined8 local_108;
  undefined1 uStack_100;
  undefined2 uStack_ff;
  undefined1 uStack_fd;
  undefined1 uStack_fc;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  bVar5 = 0;
  local_108._0_1_ = 0x66;
  local_108._1_1_ = 0x6f;
  local_108._2_1_ = 0x6f;
  local_108._3_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%3c",&local_98);
  if (iVar1 != 1) {
    main_cold_1();
  }
  if (local_98._2_1_ != 'o' || (short)(int)local_98 != 0x6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0xc,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  local_108._2_1_ = 0;
  local_108._0_1_ = 0x25;
  local_108._1_1_ = 0x78;
  iVar1 = __isoc99_sscanf(&local_108,"%%%c%n",&local_98,&local_118);
  if (iVar1 != 1) {
    main_cold_2();
  }
  if (local_118 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x10,"n == 2");
  }
  if ((char)local_98 != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x11,"buffer[0] == \'x\'");
  }
  local_108._0_1_ = 0x61;
  local_108._1_1_ = 0x62;
  local_108._2_1_ = 99;
  local_108._3_1_ = 100;
  local_108._4_1_ = 0x65;
  local_108._5_1_ = 0x66;
  local_108._6_1_ = 0x67;
  local_108._7_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%*[cba]%n",&local_118);
  if (iVar1 != 0) {
    main_cold_3();
  }
  if (local_118 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x14,"n == 3");
  }
  local_108._0_1_ = 0x66;
  local_108._1_1_ = 0x6f;
  local_108._2_1_ = 0x6f;
  local_108._3_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%*s%n",&local_118);
  if (iVar1 != 0) {
    main_cold_4();
  }
  if (local_118 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x16,"n == 3");
  }
  local_108._0_1_ = 0x61;
  local_108._1_1_ = 0x62;
  local_108._2_1_ = 99;
  local_108._3_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%*c%n",&local_118);
  if (iVar1 != 0) {
    main_cold_5();
  }
  if (local_118 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x18,"n == 1");
  }
  local_108._4_1_ = 0x6f;
  local_108._5_1_ = 0;
  local_108._0_1_ = 0x33;
  local_108._1_1_ = 0x78;
  local_108._2_1_ = 0x66;
  local_108._3_1_ = 0x6f;
  iVar1 = __isoc99_sscanf(&local_108,"%*dx%3c",&local_98);
  if (iVar1 != 1) {
    main_cold_6();
  }
  if (local_98._2_1_ != 'o' || (short)(int)local_98 != 0x6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x1a,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  local_108._0_1_ = 0x2d;
  local_108._1_1_ = 0x32;
  local_108._2_1_ = 0x31;
  local_108._3_1_ = 0x34;
  local_108._4_1_ = 0x37;
  local_108._5_1_ = 0x34;
  local_108._6_1_ = 0x38;
  local_108._7_1_ = 0x33;
  uStack_100 = 0x36;
  uStack_ff = 0x3834;
  uStack_fd = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%d",&local_11c);
  if (iVar1 != 1) {
    main_cold_7();
  }
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
         ,0x1e,"i == INT_MIN");
  local_108._0_1_ = 0x32;
  local_108._1_1_ = 0x31;
  local_108._2_1_ = 0x34;
  local_108._3_1_ = 0x37;
  local_108._4_1_ = 0x34;
  local_108._5_1_ = 0x38;
  local_108._6_1_ = 0x33;
  local_108._7_1_ = 0x36;
  uStack_100 = 0x34;
  uStack_ff = 0x37;
  iVar1 = __isoc99_sscanf(&local_108,"%d",&local_11c);
  if (iVar1 != 1) {
    main_cold_8();
  }
  if (local_11c != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x20,"i == INT_MAX");
  }
  local_108._2_1_ = 0;
  local_108._0_1_ = 0x2d;
  local_108._1_1_ = 0x31;
  iVar1 = __isoc99_sscanf(&local_108,"%d",&local_11c);
  if (iVar1 != 1) {
    main_cold_9();
  }
  if (local_11c != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x22,"i == -1");
  }
  local_108._0_1_ = 0x30;
  local_108._1_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%d",&local_11c);
  if (iVar1 != 1) {
    main_cold_10();
  }
  if (local_11c != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x24,"i == 0");
  }
  local_108._0_1_ = 0x31;
  local_108._1_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%d",&local_11c);
  if (iVar1 != 1) {
    main_cold_11();
  }
  if (local_11c != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x26,"i == 1");
  }
  local_108._0_1_ = 0x2d;
  local_108._1_1_ = 0x32;
  local_108._2_1_ = 0x31;
  local_108._3_1_ = 0x34;
  local_108._4_1_ = 0x37;
  local_108._5_1_ = 0x34;
  local_108._6_1_ = 0x38;
  local_108._7_1_ = 0x33;
  uStack_100 = 0x36;
  uStack_ff = 0x3834;
  uStack_fd = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_12();
  }
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
         ,0x28,"i == INT_MIN");
  local_108._0_1_ = 0x32;
  local_108._1_1_ = 0x31;
  local_108._2_1_ = 0x34;
  local_108._3_1_ = 0x37;
  local_108._4_1_ = 0x34;
  local_108._5_1_ = 0x38;
  local_108._6_1_ = 0x33;
  local_108._7_1_ = 0x36;
  uStack_100 = 0x34;
  uStack_ff = 0x37;
  iVar1 = __isoc99_sscanf(&local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_13();
  }
  if (local_11c != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2a,"i == INT_MAX");
  }
  local_108._2_1_ = 0;
  local_108._0_1_ = 0x2d;
  local_108._1_1_ = 0x31;
  iVar1 = __isoc99_sscanf(&local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_14();
  }
  if (local_11c != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2c,"i == -1");
  }
  local_108._0_1_ = 0x30;
  local_108._1_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_15();
  }
  if (local_11c != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2e,"i == 0");
  }
  local_108._0_1_ = 0x31;
  local_108._1_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_16();
  }
  if (local_11c != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x30,"i == 1");
  }
  local_108._0_1_ = 0x30;
  local_108._1_1_ = 0x78;
  local_108._2_1_ = 0x37;
  local_108._3_1_ = 0x46;
  local_108._4_1_ = 0x46;
  local_108._5_1_ = 0x46;
  local_108._6_1_ = 0x46;
  local_108._7_1_ = 0x46;
  uStack_100 = 0x46;
  uStack_ff = 0x46;
  iVar1 = __isoc99_sscanf(&local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_17();
  }
  if (local_11c != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x32,"i == INT_MAX");
  }
  local_108._0_1_ = 0x30;
  local_108._1_1_ = 0x78;
  local_108._2_1_ = 0x30;
  local_108._3_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_18();
  }
  if (local_11c != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x34,"i == 0");
  }
  local_108._2_1_ = 0;
  local_108._0_1_ = 0x30;
  local_108._1_1_ = 0x30;
  iVar1 = __isoc99_sscanf(&local_108,"%i%n",&local_11c,&local_118);
  if (iVar1 != 1) {
    main_cold_19();
  }
  if (local_11c != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x37,"i == 0");
  }
  if (local_118 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x38,"n == 2");
  }
  local_108._0_1_ = 0x34;
  local_108._1_1_ = 0x32;
  local_108._2_1_ = 0x39;
  local_108._3_1_ = 0x34;
  local_108._4_1_ = 0x39;
  local_108._5_1_ = 0x36;
  local_108._6_1_ = 0x37;
  local_108._7_1_ = 0x32;
  uStack_100 = 0x39;
  uStack_ff = 0x35;
  iVar1 = __isoc99_sscanf(&local_108,"%u",&local_114);
  if (iVar1 != 1) {
    main_cold_20();
  }
  if (local_114 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x3c,"u == UINT_MAX");
  }
  local_108._0_1_ = 0x30;
  local_108._1_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%u",&local_114);
  if (iVar1 != 1) {
    main_cold_21();
  }
  if (local_114 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x3e,"u == 0");
  }
  local_108._0_1_ = 0x66;
  local_108._1_1_ = 0x46;
  local_108._2_1_ = 0x46;
  local_108._3_1_ = 0x46;
  local_108._4_1_ = 0x46;
  local_108._5_1_ = 0x46;
  local_108._6_1_ = 0x46;
  local_108._7_1_ = 0x46;
  uStack_100 = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%x",&local_114);
  if (iVar1 != 1) {
    main_cold_22();
  }
  if (local_114 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x40,"u == UINT_MAX");
  }
  local_108._0_1_ = 0x37;
  local_108._1_1_ = 0x46;
  local_108._2_1_ = 0x46;
  local_108._3_1_ = 0x46;
  local_108._4_1_ = 0x46;
  local_108._5_1_ = 0x46;
  local_108._6_1_ = 0x46;
  local_108._7_1_ = 0x46;
  uStack_100 = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%x",&local_114);
  if (iVar1 != 1) {
    main_cold_23();
  }
  if (local_114 != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x42,"u == INT_MAX");
  }
  local_108._0_1_ = 0x30;
  local_108._1_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%o",&local_114);
  if (iVar1 != 1) {
    main_cold_24();
  }
  if (local_114 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x44,"u == 0");
  }
  local_108._0_1_ = 0x33;
  local_108._1_1_ = 0x37;
  local_108._2_1_ = 0x37;
  local_108._3_1_ = 0x37;
  local_108._4_1_ = 0x37;
  local_108._5_1_ = 0x37;
  local_108._6_1_ = 0x37;
  local_108._7_1_ = 0x37;
  uStack_100 = 0x37;
  uStack_ff = 0x3737;
  uStack_fd = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%o",&local_114);
  if (iVar1 != 1) {
    main_cold_25();
  }
  if (local_114 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x46,"u == UINT_MAX");
  }
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_38 = 0;
  local_108._0_1_ = 0x78;
  local_108._1_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%c");
  if (iVar1 != 1) {
    main_cold_26();
  }
  if ((short)local_98 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x4a,"memcmp( buffer, \"x\\0\", 2 ) == 0");
  }
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_38 = 0;
  local_108._0_1_ = 0x66;
  local_108._1_1_ = 0x6f;
  local_108._2_1_ = 0x6f;
  local_108._3_1_ = 0x20;
  local_108._4_1_ = 0x62;
  local_108._5_1_ = 0x61;
  local_108._6_1_ = 0x72;
  local_108._7_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%s%n",&local_98,&local_118);
  if (iVar1 != 1) {
    main_cold_27();
  }
  if ((int)local_98 != 0x6f6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x4f,"memcmp( buffer, \"foo\\0\", 4 ) == 0");
  }
  if (local_118 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x50,"n == 3");
  }
  uStack_100 = 0x20;
  uStack_ff = 0x6162;
  uStack_fd = 0x7a;
  uStack_fc = 0;
  local_108._0_1_ = 0x66;
  local_108._1_1_ = 0x6f;
  local_108._2_1_ = 0x6f;
  local_108._3_1_ = 0x20;
  local_108._4_1_ = 0x62;
  local_108._5_1_ = 0x61;
  local_108._6_1_ = 0x72;
  local_108._7_1_ = 0x20;
  iVar1 = __isoc99_sscanf(&local_108,"%s %s %n",&local_98,(long)&local_98 + 4,&local_118);
  if (iVar1 != 2) {
    main_cold_28();
  }
  if (local_118 != 9) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x52,"n == 9");
  }
  if (local_98 != 0x726162006f6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x53,"memcmp( buffer, \"foo\\0bar\\0\", 8 ) == 0");
  }
  local_108._0_1_ = 0x61;
  local_108._1_1_ = 0x62;
  local_108._2_1_ = 99;
  local_108._3_1_ = 100;
  local_108._4_1_ = 0x65;
  local_108._5_1_ = 0x66;
  local_108._6_1_ = 0x67;
  local_108._7_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%[cba]",&local_98);
  if (iVar1 != 1) {
    main_cold_29();
  }
  if ((int)local_98 != 0x636261) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x57,"memcmp( buffer, \"abc\\0\", 4 ) == 0");
  }
  local_108._0_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%[cba]",&local_98);
  if (iVar1 != -1) {
    main_cold_30();
  }
  local_108._0_1_ = 0x33;
  local_108._1_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%u%[cba]",&local_114,&local_98);
  if (iVar1 != 1) {
    main_cold_31();
  }
  local_110 = (int *)0x0;
  sprintf((char *)&local_98,"%p",0);
  pcVar3 = (char *)&local_98;
  puVar4 = &local_108;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pcVar3;
    pcVar3 = pcVar3 + (ulong)bVar5 * -0x10 + 8;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  local_a8 = local_38;
  local_110 = &local_11c;
  iVar1 = __isoc99_sscanf(&local_108,"%p",&local_110);
  if (iVar1 != 1) {
    main_cold_32();
  }
  if (local_110 != (int *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x61,"p == NULL");
  }
  local_110 = &local_11c;
  sprintf((char *)&local_98,"%p",&local_11c);
  local_110 = (int *)0x0;
  pcVar3 = (char *)&local_98;
  puVar4 = &local_108;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pcVar3;
    pcVar3 = pcVar3 + (ulong)bVar5 * -0x10 + 8;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  local_a8 = local_38;
  iVar1 = __isoc99_sscanf(&local_108,"%p",&local_110);
  if (iVar1 != 1) {
    main_cold_33();
  }
  if (local_110 != &local_11c) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x66,"p == &i");
  }
  local_108._0_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%d",&local_11c);
  if (iVar1 != -1) {
    main_cold_34();
  }
  local_108._0_1_ = 0x66;
  local_108._1_1_ = 0x6f;
  local_108._2_1_ = 0x6f;
  local_108._3_1_ = 0;
  iVar1 = __isoc99_sscanf(&local_108,"%5c",&local_98);
  if (iVar1 != 1) {
    main_cold_35();
  }
  if (local_98._2_1_ != 'o' || (short)local_98 != 0x6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x6a,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char source[100];
#include "scanf_testcases.h"
    return TEST_RESULTS;
}